

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  ExprList_item *pEVar1;
  byte *pbVar2;
  u8 uVar3;
  Vdbe *pVVar4;
  Index *pIVar5;
  sqlite3 *db;
  Expr *pEVar6;
  int iVar7;
  ExprList *pEVar8;
  InLoop *pIVar9;
  long lVar10;
  anon_union_4_2_6146edf4_for_u *paVar11;
  long lVar12;
  Expr *pEVar13;
  int op;
  ulong uVar14;
  ExprList_item *pEVar15;
  int p3;
  int iVar16;
  long lVar17;
  uint uVar18;
  WhereLoop *pWVar19;
  bool bVar20;
  bool bVar21;
  int iTab;
  int local_ac;
  sqlite3 *local_a8;
  int local_a0;
  int local_9c;
  Expr *local_98;
  Parse *local_90;
  ExprList *local_88;
  WhereLoop *local_80;
  ExprList *local_78;
  ulong local_70;
  WhereLevel *local_68;
  WhereTerm *local_60;
  Vdbe *local_58;
  ExprList *local_50;
  ExprList *local_48;
  ExprList_item *local_40;
  ExprList_item *local_38;
  
  pEVar13 = pTerm->pExpr;
  uVar3 = pEVar13->op;
  if (uVar3 != '5') {
    pVVar4 = pParse->pVdbe;
    if (uVar3 == '2') {
      sqlite3VdbeAddOp3(pVVar4,0x49,0,iTarget,0);
      goto LAB_0019e244;
    }
    if (uVar3 != '-') {
      local_80 = (WhereLoop *)CONCAT44(local_80._4_4_,bRev);
      pWVar19 = pLevel->pWLoop;
      if ((((pWVar19->wsFlags & 0x400) == 0) &&
          (pIVar5 = (pWVar19->u).btree.pIndex, pIVar5 != (Index *)0x0)) &&
         (pIVar5->aSortOrder[iEq] != '\0')) {
        local_80 = (WhereLoop *)CONCAT44(local_80._4_4_,(uint)(bRev == 0));
      }
      bVar20 = 0 < iEq;
      local_58 = pVVar4;
      if (0 < iEq) {
        uVar14 = 1;
        do {
          if ((pWVar19->aLTerm[uVar14 - 1] != (WhereTerm *)0x0) &&
             (pWVar19->aLTerm[uVar14 - 1]->pExpr == pEVar13)) {
            disableTerm(pLevel,pTerm);
            goto LAB_0019e23d;
          }
          bVar20 = uVar14 < (uint)iEq;
          bVar21 = uVar14 != (uint)iEq;
          uVar14 = uVar14 + 1;
        } while (bVar21);
      }
      iVar16 = 0;
      if (iEq < (int)(uint)pWVar19->nLTerm) {
        uVar14 = (ulong)iEq;
        iVar16 = 0;
        do {
          iVar16 = iVar16 + (uint)(pWVar19->aLTerm[uVar14]->pExpr == pEVar13);
          uVar14 = uVar14 + 1;
        } while (pWVar19->nLTerm != uVar14);
      }
      local_ac = 0;
      uVar14 = (ulong)iVar16;
      local_a0 = iTarget;
      local_9c = iEq;
      local_90 = pParse;
      local_68 = pLevel;
      local_60 = pTerm;
      if (((pEVar13->flags & 0x800) == 0) || (((pEVar13->x).pSelect)->pEList->nExpr == 1)) {
        local_88 = (ExprList *)0x0;
        iVar16 = sqlite3FindInIndex(pParse,pEVar13,4,(int *)0x0,(int *)0x0,&local_ac);
      }
      else {
        db = pParse->db;
        local_70 = uVar14;
        local_98 = exprDup(db,pEVar13,0,(u8 **)0x0);
        local_a8 = db;
        if (db->mallocFailed == '\0') {
          local_50 = ((local_98->x).pSelect)->pEList;
          local_48 = (local_98->pLeft->x).pList;
          if (local_9c < (int)(uint)pWVar19->nLTerm) {
            pEVar15 = local_50->a;
            pEVar1 = local_48->a;
            lVar12 = (long)local_9c;
            local_78 = (ExprList *)0x0;
            pEVar8 = (ExprList *)0x0;
            local_40 = pEVar1;
            local_38 = pEVar15;
            do {
              if (pWVar19->aLTerm[lVar12]->pExpr == pEVar13) {
                lVar17 = (long)pWVar19->aLTerm[lVar12]->iField + -1;
                if (pEVar15[lVar17].pExpr != (Expr *)0x0) {
                  local_88 = pEVar8;
                  local_78 = sqlite3ExprListAppend(local_90,local_78,pEVar15[lVar17].pExpr);
                  pParse = local_90;
                  pEVar15[lVar17].pExpr = (Expr *)0x0;
                  pEVar8 = sqlite3ExprListAppend(local_90,local_88,pEVar1[lVar17].pExpr);
                  pEVar1[lVar17].pExpr = (Expr *)0x0;
                  pEVar15 = local_38;
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)(ulong)pWVar19->nLTerm);
          }
          else {
            pEVar8 = (ExprList *)0x0;
            local_78 = (ExprList *)0x0;
          }
          if (local_50 != (ExprList *)0x0) {
            exprListDeleteNN(local_a8,local_50);
          }
          pTerm = local_60;
          pLevel = local_68;
          pEVar13 = local_98;
          if (local_48 != (ExprList *)0x0) {
            exprListDeleteNN(local_a8,local_48);
          }
          (pEVar13->pLeft->x).pList = pEVar8;
          ((pEVar13->x).pSelect)->pEList = local_78;
          if ((pEVar8 != (ExprList *)0x0) && (pEVar8->nExpr == 1)) {
            pEVar6 = pEVar8->a[0].pExpr;
            pEVar8->a[0].pExpr = (Expr *)0x0;
            if (pEVar13->pLeft != (Expr *)0x0) {
              sqlite3ExprDeleteNN(local_a8,pEVar13->pLeft);
            }
            pEVar13->pLeft = pEVar6;
            pParse = local_90;
          }
          pEVar8 = ((pEVar13->x).pSelect)->pOrderBy;
          if ((pEVar8 != (ExprList *)0x0) && (0 < pEVar8->nExpr)) {
            paVar11 = &pEVar8->a[0].u;
            lVar12 = 0;
            do {
              (paVar11->x).iOrderByCol = 0;
              lVar12 = lVar12 + 1;
              paVar11 = paVar11 + 8;
            } while (lVar12 < pEVar8->nExpr);
          }
        }
        uVar14 = local_70;
        if (local_a8->mallocFailed == '\0') {
          local_88 = (ExprList *)sqlite3DbMallocZero(pParse->db,local_70 * 4);
          pEVar13 = local_98;
          iVar16 = sqlite3FindInIndex(pParse,local_98,4,(int *)0x0,(int *)local_88,&local_ac);
          pTerm->pExpr->iTable = local_ac;
        }
        else {
          iVar16 = 5;
          local_88 = (ExprList *)0x0;
          pEVar13 = local_98;
        }
        if (pEVar13 != (Expr *)0x0) {
          sqlite3ExprDeleteNN(local_a8,pEVar13);
        }
        pEVar13 = pTerm->pExpr;
      }
      local_78 = (ExprList *)CONCAT44(local_78._4_4_,iVar16);
      uVar18 = (uint)((uint)local_80 == 0);
      if (iVar16 != 4) {
        uVar18 = (uint)local_80;
      }
      sqlite3VdbeAddOp3(local_58,(uint)(uVar18 == 0) * 4 + 0x20,local_ac,0,0);
      pbVar2 = (byte *)((long)&pWVar19->wsFlags + 1);
      *pbVar2 = *pbVar2 | 8;
      if ((pLevel->u).in.nIn == 0) {
        iVar16 = local_90->nLabel + -1;
        local_90->nLabel = iVar16;
        pLevel->addrNxt = iVar16;
      }
      lVar17 = (long)(pLevel->u).in.nIn;
      lVar12 = uVar14 + lVar17;
      (pLevel->u).in.nIn = (int)lVar12;
      pIVar9 = (InLoop *)sqlite3DbReallocOrFree(local_90->db,(pLevel->u).in.aInLoop,lVar12 * 0x14);
      (pLevel->u).in.aInLoop = pIVar9;
      if (pIVar9 == (InLoop *)0x0) {
        (pLevel->u).in.nIn = 0;
      }
      else if (local_9c < (int)(uint)pWVar19->nLTerm) {
        pIVar9 = pIVar9 + lVar17;
        local_98 = (Expr *)(CONCAT71(local_98._1_7_,uVar18 == 0) | 4);
        lVar12 = (long)local_9c;
        local_70 = (ulong)(uint)(local_a0 - local_9c);
        lVar17 = 0;
        local_a8 = (sqlite3 *)((ulong)local_a8 & 0xffffffff00000000);
        iVar16 = local_a0;
        local_80 = pWVar19;
        do {
          pVVar4 = local_58;
          if (pWVar19->aLTerm[lVar12]->pExpr == pEVar13) {
            if ((int)local_78 == 1) {
              op = 0x80;
              iVar7 = iVar16;
              p3 = 0;
            }
            else {
              if (local_88 == (ExprList *)0x0) {
                iVar7 = 0;
              }
              else {
                lVar10 = (long)(int)local_a8;
                local_a8 = (sqlite3 *)CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
                iVar7 = *(int *)((long)local_88->a + lVar10 * 4 + -8);
              }
              op = 0x5a;
              p3 = iVar16;
            }
            iVar7 = sqlite3VdbeAddOp3(local_58,op,local_ac,iVar7,p3);
            pIVar9->addrInTop = iVar7;
            sqlite3VdbeAddOp3(pVVar4,0x32,iVar16,0,0);
            if (lVar17 == 0) {
              pIVar9->iCur = local_ac;
              pIVar9->eEndLoopOp = (u8)local_98;
              if ((local_9c < 1) || (uVar18 = local_80->wsFlags, (uVar18 >> 10 & 1) != 0)) {
                pIVar9->nPrefix = 0;
              }
              else {
                pIVar9->iBase = (int)local_70;
                pIVar9->nPrefix = (int)lVar12;
                local_80->wsFlags = uVar18 | 0x40000;
              }
            }
            else {
              pIVar9->eEndLoopOp = 0xaa;
            }
            pIVar9 = pIVar9 + 1;
            pWVar19 = local_80;
          }
          lVar12 = lVar12 + 1;
          lVar17 = lVar17 + -1;
          iVar16 = iVar16 + 1;
        } while (lVar12 < (long)(ulong)pWVar19->nLTerm);
      }
      pTerm = local_60;
      pLevel = local_68;
      iTarget = local_a0;
      if (local_88 != (ExprList *)0x0) {
        sqlite3DbFreeNN(local_90->db,local_88);
        pTerm = local_60;
        pLevel = local_68;
        iTarget = local_a0;
      }
LAB_0019e23d:
      if (bVar20) {
        return iTarget;
      }
      goto LAB_0019e244;
    }
  }
  iTarget = sqlite3ExprCodeTarget(pParse,pEVar13->pRight,iTarget);
LAB_0019e244:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
        pTerm->pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}